

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

bool __thiscall IR::Opnd::IsArgumentsObject(Opnd *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  _func_int **pp_Var3;
  
  if (this->m_kind == OpndKindReg) {
    pp_Var3 = this[1]._vptr_Opnd;
  }
  else if ((this->m_kind == OpndKindSym) &&
          (pp_Var1 = this[1]._vptr_Opnd, pp_Var1 != (_func_int **)0x0)) {
    pp_Var3 = (_func_int **)0x0;
    if (*(char *)((long)pp_Var1 + 0x14) == '\x01') {
      pp_Var3 = pp_Var1;
    }
  }
  else {
    pp_Var3 = (_func_int **)0x0;
  }
  if ((pp_Var3 != (_func_int **)0x0) &&
     (((Instr *)pp_Var3[5] != (Instr *)0x0 & *(byte *)(pp_Var3 + 3)) == 1)) {
    bVar2 = Instr::HasAnyLoadHeapArgsOpCode((Instr *)pp_Var3[5]);
    return bVar2;
  }
  return false;
}

Assistant:

bool
Opnd::IsArgumentsObject()
{
    // returns "false" if the sym is not single def (happens when the parent function has formals); the opnd can still be the arguments object.
    // Since we need this information in the inliner where we don't track arguments object sym, going with single def is the best option.
    StackSym * sym = this->GetStackSym();

    return sym && sym->IsSingleDef() && sym->GetInstrDef()->HasAnyLoadHeapArgsOpCode();
}